

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.c
# Opt level: O0

void write_hierarchy(bsdtar *bsdtar,archive *a,char *path)

{
  FILE *f;
  archive_entry *paVar1;
  wchar_t wVar2;
  int iVar3;
  int code;
  mode_t mVar4;
  char *pcVar5;
  archive_entry *paStack_38;
  int r;
  archive_entry *spare_entry;
  archive_entry *entry;
  archive *disk;
  char *path_local;
  archive *a_local;
  bsdtar *bsdtar_local;
  
  entry = (archive_entry *)bsdtar->diskreader;
  spare_entry = (archive_entry *)0x0;
  paStack_38 = (archive_entry *)0x0;
  disk = (archive *)path;
  path_local = (char *)a;
  a_local = (archive *)bsdtar;
  wVar2 = archive_read_disk_open((archive *)entry,path);
  if (wVar2 != L'\0') {
    iVar3 = archive_errno((archive *)entry);
    pcVar5 = archive_error_string((archive *)entry);
    lafe_warnc(iVar3,"%s",pcVar5);
    a_local[1].archive_error_number = 1;
    return;
  }
  *(undefined4 *)&a_local[1].read_data_block = 0xffffffff;
LAB_00112533:
  archive_entry_free(spare_entry);
  spare_entry = archive_entry_new();
  iVar3 = archive_read_next_header2((archive *)entry,spare_entry);
  if (iVar3 == 1) {
    archive_entry_free(spare_entry);
    archive_read_close((archive *)entry);
    return;
  }
  if (iVar3 != 0) goto code_r0x00112566;
  goto LAB_001125cf;
code_r0x00112566:
  code = archive_errno((archive *)entry);
  pcVar5 = archive_error_string((archive *)entry);
  lafe_warnc(code,"%s",pcVar5);
  if ((iVar3 == -0x1e) || (iVar3 == -0x19)) {
    a_local[1].archive_error_number = 1;
    archive_entry_free(spare_entry);
    archive_read_close((archive *)entry);
    return;
  }
  if (-0x15 < iVar3) {
LAB_001125cf:
    if ((-1 < (int)(a_local->error_string).buffer_length) &&
       (archive_entry_set_uid(spare_entry,(long)(int)(a_local->error_string).buffer_length),
       paVar1 = spare_entry, a_local->current_code == (char *)0x0)) {
      pcVar5 = archive_read_disk_uname
                         ((archive *)a_local[1].error_string.s,
                          (long)(int)(a_local->error_string).buffer_length);
      archive_entry_set_uname(paVar1,pcVar5);
    }
    if ((-1 < *(int *)((long)&(a_local->error_string).s + 4)) &&
       (archive_entry_set_gid(spare_entry,(long)*(int *)((long)&(a_local->error_string).s + 4)),
       paVar1 = spare_entry, (a_local->error_string).length == 0)) {
      pcVar5 = archive_read_disk_gname
                         ((archive *)a_local[1].error_string.s,
                          (long)*(int *)((long)&(a_local->error_string).s + 4));
      archive_entry_set_gname(paVar1,pcVar5);
    }
    if (a_local->current_code != (char *)0x0) {
      archive_entry_set_uname(spare_entry,a_local->current_code);
    }
    if ((a_local->error_string).length != 0) {
      archive_entry_set_gname(spare_entry,(char *)(a_local->error_string).length);
    }
    wVar2 = edit_pathname((bsdtar *)a_local,spare_entry);
    f = _stderr;
    if (wVar2 == L'\0') {
      if (a_local->file_count < 2) {
        if (0 < a_local->file_count) {
          pcVar5 = archive_entry_pathname(spare_entry);
          safe_fprintf((FILE *)f,"a %s",pcVar5);
        }
      }
      else {
        safe_fprintf((FILE *)_stderr,"a ");
        list_item_verbose((bsdtar *)a_local,(FILE *)_stderr,spare_entry);
      }
      mVar4 = archive_entry_filetype(spare_entry);
      if (mVar4 != 0x8000) {
        archive_entry_set_size(spare_entry,0);
      }
      archive_entry_linkify
                ((archive_entry_linkresolver *)a_local[1].error_string.length,&spare_entry,
                 &stack0xffffffffffffffc8);
      while (spare_entry != (archive_entry *)0x0) {
        write_file((bsdtar *)a_local,(archive *)path_local,spare_entry);
        if (spare_entry != paStack_38) {
          archive_entry_free(spare_entry);
        }
        spare_entry = paStack_38;
        paStack_38 = (archive_entry *)0x0;
      }
      if (a_local->file_count != 0) {
        fprintf(_stderr,"\n");
      }
    }
  }
  goto LAB_00112533;
}

Assistant:

static void
write_hierarchy(struct bsdtar *bsdtar, struct archive *a, const char *path)
{
	struct archive *disk = bsdtar->diskreader;
	struct archive_entry *entry = NULL, *spare_entry = NULL;
	int r;

	r = archive_read_disk_open(disk, path);
	if (r != ARCHIVE_OK) {
		lafe_warnc(archive_errno(disk),
		    "%s", archive_error_string(disk));
		bsdtar->return_value = 1;
		return;
	}
	bsdtar->first_fs = -1;

	for (;;) {
		archive_entry_free(entry);
		entry = archive_entry_new();
		r = archive_read_next_header2(disk, entry);
		if (r == ARCHIVE_EOF)
			break;
		else if (r != ARCHIVE_OK) {
			lafe_warnc(archive_errno(disk),
			    "%s", archive_error_string(disk));
			if (r == ARCHIVE_FATAL || r == ARCHIVE_FAILED) {
				bsdtar->return_value = 1;
				archive_entry_free(entry);
				archive_read_close(disk);
				return;
			} else if (r < ARCHIVE_WARN)
				continue;
		}

		if (bsdtar->uid >= 0) {
			archive_entry_set_uid(entry, bsdtar->uid);
			if (!bsdtar->uname)
				archive_entry_set_uname(entry,
				    archive_read_disk_uname(bsdtar->diskreader,
					bsdtar->uid));
		}
		if (bsdtar->gid >= 0) {
			archive_entry_set_gid(entry, bsdtar->gid);
			if (!bsdtar->gname)
				archive_entry_set_gname(entry,
				    archive_read_disk_gname(bsdtar->diskreader,
					bsdtar->gid));
		}
		if (bsdtar->uname)
			archive_entry_set_uname(entry, bsdtar->uname);
		if (bsdtar->gname)
			archive_entry_set_gname(entry, bsdtar->gname);

		/*
		 * Rewrite the pathname to be archived.  If rewrite
		 * fails, skip the entry.
		 */
		if (edit_pathname(bsdtar, entry))
			continue;

		/* Display entry as we process it. */
		if (bsdtar->verbose > 1) {
			safe_fprintf(stderr, "a ");
			list_item_verbose(bsdtar, stderr, entry);
		} else if (bsdtar->verbose > 0) {
		/* This format is required by SUSv2. */
			safe_fprintf(stderr, "a %s",
			    archive_entry_pathname(entry));
		}

		/* Non-regular files get archived with zero size. */
		if (archive_entry_filetype(entry) != AE_IFREG)
			archive_entry_set_size(entry, 0);

		archive_entry_linkify(bsdtar->resolver, &entry, &spare_entry);

		while (entry != NULL) {
			write_file(bsdtar, a, entry);
			if (entry != spare_entry) {
				archive_entry_free(entry);
			}
			entry = spare_entry;
			spare_entry = NULL;
		}

		if (bsdtar->verbose)
			fprintf(stderr, "\n");
	}
	archive_entry_free(entry);
	archive_read_close(disk);
}